

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_common.c
# Opt level: O0

void buffer_destroy(Buffer *buffer)

{
  MOJOSHADER_free p_Var1;
  void *pvVar2;
  void *d;
  MOJOSHADER_free f;
  Buffer *buffer_local;
  
  if (buffer != (Buffer *)0x0) {
    p_Var1 = buffer->f;
    pvVar2 = buffer->d;
    buffer_empty(buffer);
    (*p_Var1)(buffer,pvVar2);
  }
  return;
}

Assistant:

void buffer_destroy(Buffer *buffer)
{
    if (buffer != NULL)
    {
        MOJOSHADER_free f = buffer->f;
        void *d = buffer->d;
        buffer_empty(buffer);
        f(buffer, d);
    } // if
}